

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-attack.c
# Opt level: O3

_Bool monster_can_cast(monster_conflict *mon,_Bool innate)

{
  bitflag *flags;
  int iVar1;
  loc grid2;
  loc grid;
  loc grid2_00;
  _Bool _Var2;
  uint32_t uVar3;
  wchar_t wVar4;
  loc *gp;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  loc tgrid;
  wchar_t tdist;
  loc local_40;
  uint local_34;
  
  iVar1 = *(int *)(mon->race->flags + (ulong)!innate * 4 + -0xc);
  monster_get_target_dist_grid(mon,(int *)&local_34,&local_40);
  flags = mon->mflag;
  _Var2 = flag_has_dbg(flags,2,3,"mon->mflag","MFLAG_NICE");
  if ((iVar1 != 0 && !_Var2) && ((mon->target).midx != L'\0')) {
    iVar6 = iVar1 / 2;
    if (player->timed[0x30] == 0) {
      iVar6 = iVar1;
    }
    _Var2 = flag_has_dbg(flags,2,0xb,"mon->mflag","MFLAG_LESS_SPELL");
    if (_Var2) {
      iVar6 = iVar6 / 2;
      flag_off(flags,2,0xb);
    }
    bVar7 = local_34 == mon->best_range;
    uVar3 = Rand_div(100);
    if ((((int)uVar3 < iVar6 << bVar7) && ((int)local_34 <= (int)(uint)z_info->max_range)) &&
       (grid2.y = local_40.y, grid2.x = local_40.x,
       _Var2 = projectable((chunk *)cave,mon->grid,grid2,L'\x2000'), _Var2)) {
      if ((local_40.x == (player->grid).x) && (local_40.y == (player->grid).y)) {
        return true;
      }
      _Var2 = square_isview(cave,mon->grid);
      if (_Var2) {
        return true;
      }
      grid.y = local_40.y;
      grid.x = local_40.x;
      _Var2 = square_isview(cave,grid);
      if (_Var2) {
        return true;
      }
      gp = (loc *)mem_alloc((ulong)z_info->max_range << 3);
      grid2_00.y = local_40.y;
      grid2_00.x = local_40.x;
      wVar4 = project_path((chunk *)cave,gp,(uint)z_info->max_range,mon->grid,grid2_00,L'\x2000');
      if (L'\0' < wVar4) {
        uVar5 = 0;
        do {
          _Var2 = square_isview(cave,gp[uVar5]);
          if (_Var2) {
            mem_free(gp);
            return true;
          }
          uVar5 = uVar5 + 1;
        } while ((uint)wVar4 != uVar5);
      }
      mem_free(gp);
    }
  }
  return false;
}

Assistant:

static bool monster_can_cast(struct monster *mon, bool innate)
{
	int chance = innate ? mon->race->freq_innate : mon->race->freq_spell;
	int tdist;
	struct loc tgrid;

	monster_get_target_dist_grid(mon, &tdist, &tgrid);

	/* Cannot cast spells when nice */
	if (mflag_has(mon->mflag, MFLAG_NICE)) return false;

	/* Not allowed to cast spells */
	if (!chance) return false;

	/* No target to cast at */
	if (mon->target.midx == 0) return false;

	/* Taunted monsters are likely just to attack */
	if (player->timed[TMD_TAUNT]) {
		chance /= 2;
	}

	/* Monsters who have had mana burnt will cast less for this turn */
	if (mflag_has(mon->mflag, MFLAG_LESS_SPELL)) {
		chance /= 2;
		mflag_off(mon->mflag, MFLAG_LESS_SPELL);
	}

	/* Monsters at their preferred range are more likely to cast */
	if (tdist == mon->best_range) {
		chance *= 2;
	}

	/* Only do spells occasionally */
	if (randint0(100) >= chance) return false;

	/* Check range */
	if (tdist > z_info->max_range) return false;

	/* Check path */
	if (!projectable(cave, mon->grid, tgrid, PROJECT_SHORT))
		return false;

	/* If the target isn't the player, only cast if the player can witness */
	if ((tgrid.x != player->grid.x || tgrid.y != player->grid.y) &&
		!square_isview(cave, mon->grid) &&
		!square_isview(cave, tgrid)) {
		struct loc *path = mem_alloc(z_info->max_range * sizeof(*path));
		int npath, ipath;

		npath = project_path(cave, path, z_info->max_range, mon->grid, tgrid,
			PROJECT_SHORT);
		ipath = 0;
		while (1) {
			if (ipath >= npath) {
				/* No point on path visible.  Don't cast. */
				mem_free(path);
				return false;
			}
			if (square_isview(cave, path[ipath])) {
				break;
			}
			++ipath;
		}
		mem_free(path);
	}

	return true;
}